

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlNodeCopyFanin(Fra_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x247,"void Fra_SmlNodeCopyFanin(Fra_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
    if (iFrame == 0) {
      iVar2 = p->nWordsFrame;
      iVar7 = p->nWordsTotal;
    }
    else {
      iVar2 = p->nWordsFrame;
      iVar7 = p->nWordsTotal;
      if (iVar7 <= iVar2) {
        __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                      ,0x249,"void Fra_SmlNodeCopyFanin(Fra_Sml_t *, Aig_Obj_t *, int)");
      }
    }
    lVar4 = (long)(pObj->Id * iVar7);
    pAVar1 = pObj->pFanin0;
    lVar5 = (long)(iVar7 * *(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24));
    if ((pAVar1 == (Aig_Obj_t *)0x0) ||
       ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0)) {
      lVar3 = (long)(iVar2 * iFrame) * 4;
      for (lVar6 = 0; lVar6 < p->nWordsFrame; lVar6 = lVar6 + 1) {
        *(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar3 + lVar4 * 4) =
             ~*(uint *)((long)&p[1].pAig + lVar6 * 4 + lVar3 + lVar5 * 4);
      }
    }
    else {
      lVar3 = (long)(iVar2 * iFrame) * 4;
      for (lVar6 = 0; lVar6 < p->nWordsFrame; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)&p[1].pAig + lVar6 * 4 + lVar3 + lVar4 * 4) =
             *(undefined4 *)((long)&p[1].pAig + lVar6 * 4 + lVar3 + lVar5 * 4);
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x248,"void Fra_SmlNodeCopyFanin(Fra_Sml_t *, Aig_Obj_t *, int)");
}

Assistant:

void Fra_SmlNodeCopyFanin( Fra_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0;
    int fCompl, fCompl0, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Fra_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Fra_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    // copy information as it is
//    if ( Aig_ObjFaninC0(pObj) )
    if ( fCompl0 )
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims0[i];
    else
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = pSims0[i];
}